

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

uint64_t __thiscall llvm::APInt::urem(APInt *this,uint64_t RHS)

{
  bool bVar1;
  uint BitWidth;
  APInt *local_30;
  uint64_t Remainder;
  uint64_t uStack_20;
  uint lhsWords;
  uint64_t RHS_local;
  APInt *this_local;
  
  uStack_20 = RHS;
  RHS_local = (uint64_t)this;
  if (RHS == 0) {
    __assert_fail("RHS != 0 && \"Remainder by zero?\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x67e,"uint64_t llvm::APInt::urem(uint64_t) const");
  }
  bVar1 = isSingleWord(this);
  if (bVar1) {
    this_local = (APInt *)((this->U).VAL % uStack_20);
  }
  else {
    BitWidth = getActiveBits(this);
    Remainder._4_4_ = getNumWords(BitWidth);
    if (Remainder._4_4_ == 0) {
      this_local = (APInt *)0x0;
    }
    else if (uStack_20 == 1) {
      this_local = (APInt *)0x0;
    }
    else {
      bVar1 = ult(this,uStack_20);
      if (bVar1) {
        this_local = (APInt *)getZExtValue(this);
      }
      else {
        bVar1 = operator==(this,uStack_20);
        if (bVar1) {
          this_local = (APInt *)0x0;
        }
        else if (Remainder._4_4_ == 1) {
          this_local = (APInt *)(*(this->U).pVal % uStack_20);
        }
        else {
          divide((this->U).pVal,Remainder._4_4_,&stack0xffffffffffffffe0,1,(WordType *)0x0,
                 (WordType *)&local_30);
          this_local = local_30;
        }
      }
    }
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t APInt::urem(uint64_t RHS) const {
  assert(RHS != 0 && "Remainder by zero?");

  if (isSingleWord())
    return U.VAL % RHS;

  // Get some facts about the LHS
  unsigned lhsWords = getNumWords(getActiveBits());

  // Check the degenerate cases
  if (lhsWords == 0)
    // 0 % Y ===> 0
    return 0;
  if (RHS == 1)
    // X % 1 ===> 0
    return 0;
  if (this->ult(RHS))
    // X % Y ===> X, iff X < Y
    return getZExtValue();
  if (*this == RHS)
    // X % X == 0;
    return 0;
  if (lhsWords == 1)
    // All high words are zero, just use native remainder
    return U.pVal[0] % RHS;

  // We have to compute it the hard way. Invoke the Knuth divide algorithm.
  uint64_t Remainder;
  divide(U.pVal, lhsWords, &RHS, 1, nullptr, &Remainder);
  return Remainder;
}